

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bms_exception.cpp
# Opt level: O2

string * __thiscall
BmsFileOpenException::Message_abi_cxx11_(string *__return_storage_ptr__,BmsFileOpenException *this)

{
  ostream *poVar1;
  stringstream os;
  stringstream asStack_198 [16];
  ostream local_188 [376];
  
  std::__cxx11::stringstream::stringstream(asStack_198);
  poVar1 = std::operator<<(local_188,"BMS File open failed. ");
  poVar1 = std::operator<<(poVar1,(string *)&this->filename_);
  poVar1 = std::operator<<(poVar1,"(");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<(poVar1,")");
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(asStack_198);
  return __return_storage_ptr__;
}

Assistant:

std::string
BmsFileOpenException::Message( void ) const
{
  std::stringstream os;
  os << "BMS File open failed. " << filename_ << "(" << error_number_ << ")";
  return os.str();
}